

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes_test.cpp
# Opt level: O1

void __thiscall Triangle_BadCases_Test::TestBody(Triangle_BadCases_Test *this)

{
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> n;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> uv;
  vector<int,_std::allocator<int>_> faceIndices;
  bool bVar1;
  Allocator alloc;
  char *pcVar2;
  initializer_list<int> __l;
  initializer_list<pbrt::Point3<float>_> __l_00;
  pointer pPVar3;
  undefined1 in_stack_fffffffffffffcd8 [16];
  TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
  local_318;
  AssertHelper local_310;
  AssertionResult gtest_ar_;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> local_2f8;
  vector<int,_std::allocator<int>_> local_2e0;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> p;
  vector<int,_std::allocator<int>_> indices;
  void *local_298;
  undefined8 uStack_290;
  long local_288;
  void *local_278;
  undefined8 uStack_270;
  long local_268;
  void *local_258;
  undefined8 uStack_250;
  long local_248;
  vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> local_238;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_218;
  undefined4 local_210;
  undefined8 local_20c;
  undefined8 uStack_204;
  undefined8 local_1f8;
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> tris;
  TriangleMesh mesh;
  AssertionResult gtest_ar;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_180;
  undefined4 local_170;
  char local_90;
  Transform identity;
  
  pbrt::Transform::Transform(&identity);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0x1000000;
  gtest_ar.message_.ptr_._0_4_ = 2;
  __l._M_len = 3;
  __l._M_array = (iterator)&gtest_ar;
  std::vector<int,_std::allocator<int>_>::vector(&indices,__l,(allocator_type *)&mesh);
  gtest_ar.success_ = true;
  gtest_ar._1_7_ = 0xc29e1967c48b2e;
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc48b2e8cc260f907;
  aStack_180._M_allocated_capacity = 0xc260f907c2ae2f3e;
  aStack_180._8_8_ = 0xc29e6b04c48b2e8c;
  local_170 = 0xc260f907;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&gtest_ar;
  std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::vector
            (&p,__l_00,(allocator_type *)&mesh);
  std::vector<int,_std::allocator<int>_>::vector(&local_2e0,&indices);
  pPVar3 = (pointer)0x272e7e;
  std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::vector(&local_2f8,&p);
  local_238.super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258 = (void *)0x0;
  uStack_250 = 0;
  local_248 = 0;
  local_278 = (void *)0x0;
  uStack_270 = 0;
  local_268 = 0;
  local_298 = (void *)0x0;
  uStack_290 = 0;
  local_288 = 0;
  n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&local_278;
  n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_258;
  n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&local_298;
  uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffcd8._0_8_;
  uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffcd8._8_8_;
  uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = pPVar3;
  faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_4_ = local_310.data_._0_4_;
  faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)local_318.bits;
  faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish._4_4_ = local_310.data_._4_4_;
  faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = gtest_ar_.success_;
  faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._1_3_ = gtest_ar_._1_3_;
  faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = gtest_ar_._4_4_;
  pbrt::TriangleMesh::TriangleMesh
            (&mesh,&identity,false,&local_2e0,&local_2f8,&local_238,n,uv,faceIndices);
  if (local_298 != (void *)0x0) {
    operator_delete(local_298,local_288 - (long)local_298);
  }
  if (local_278 != (void *)0x0) {
    operator_delete(local_278,local_268 - (long)local_278);
  }
  if (local_258 != (void *)0x0) {
    operator_delete(local_258,local_248 - (long)local_258);
  }
  if (local_238.super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_238.
                    super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_238.
                          super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.
                          super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2f8.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f8.
                    super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2f8.
                          super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f8.
                          super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alloc.memoryResource = pstd::pmr::new_delete_resource();
  pbrt::Triangle::CreateTriangles(&tris,&mesh,alloc);
  gtest_ar_.success_ = true;
  gtest_ar_._1_3_ = 0;
  local_218.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)tris.nStored;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar,"1","tris.size()",(int *)&gtest_ar_,(unsigned_long *)&local_218);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_218);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes_test.cpp"
               ,0x1ba,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if (local_218.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_218.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_218.ptr_ + 8))();
      }
      local_218.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_218.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         0x42c7fffac4872f56;
    local_210 = 0x42af8a4c;
    local_20c = 0xc3375b1ac2006de0;
    uStack_204 = 0x3f7ff972c3109b8e;
    local_1f8 = 0;
    local_310.data_._0_4_ = 0x7f800000;
    local_318.bits =
         ((tris.ptr)->
         super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
         ).bits;
    pcVar2 = (char *)(local_318.bits >> 0x30);
    pbrt::DispatchSplit<6>::operator()(&gtest_ar);
    gtest_ar_._0_4_ = CONCAT31(gtest_ar_._1_3_,local_90) ^ 1;
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_90 == '\x01') {
      testing::Message::Message((Message *)&local_318);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,
                 (AssertionResult *)"tris[0].Intersect(ray).has_value()","true","false",pcVar2);
      testing::internal::AssertHelper::AssertHelper
                (&local_310,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes_test.cpp"
                 ,0x1bf,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=(&local_310,(Message *)&local_318);
      testing::internal::AssertHelper::~AssertHelper(&local_310);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)gtest_ar._0_8_ != &aStack_180) {
        operator_delete((void *)gtest_ar._0_8_,aStack_180._M_allocated_capacity + 1);
      }
      if ((long *)local_318.bits != (long *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && ((long *)local_318.bits != (long *)0x0)) {
          (**(code **)(*(long *)local_318.bits + 8))();
        }
        local_318.bits = 0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::~vector
            (&tris);
  if (p.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(p.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)p.
                          super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)p.
                          super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(Triangle, BadCases) {
    Transform identity;
    std::vector<int> indices{0, 1, 2};
    std::vector<Point3f> p{Point3f(-1113.45459, -79.049614, -56.2431908),
                           Point3f(-1113.45459, -87.0922699, -56.2431908),
                           Point3f(-1113.45459, -79.2090149, -56.2431908)};
    TriangleMesh mesh(identity, false, indices, p, {}, {}, {}, {});
    auto tris = Triangle::CreateTriangles(&mesh, Allocator());
    ASSERT_EQ(1, tris.size());

    Ray ray(Point3f(-1081.47925, 99.9999542, 87.7701111),
            Vector3f(-32.1072998, -183.355865, -144.607635), 0.9999);

    EXPECT_FALSE(tris[0].Intersect(ray).has_value());
}